

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_MOVPRFX_m(DisasContext_conflict1 *s,arg_rpr_esz *a)

{
  _Bool _Var1;
  _Bool extraout_AL;
  
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    do_sel_z(s,a->rd,a->rn,a->rd,a->pg,a->esz);
    return extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool trans_MOVPRFX_m(DisasContext *s, arg_rpr_esz *a)
{
    if (sve_access_check(s)) {
        do_sel_z(s, a->rd, a->rn, a->rd, a->pg, a->esz);
    }
    return true;
}